

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O2

VmConstant * LoadFrameStruct(InstructionVMEvalContext *ctx,Storage *storage,uint offset,VmType type)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  VmConstant *this;
  ulong __n;
  char *__s;
  undefined4 extraout_var_00;
  
  __n = type._0_8_ >> 0x20;
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
  __s = (char *)CONCAT44(extraout_var,iVar2);
  memset(__s,0,__n);
  bVar1 = InstructionVMEvalContext::Storage::Reserve(storage,ctx,offset,type.size);
  if (bVar1) {
    memcpy(__s,(storage->data).data + offset,__n);
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xd8);
    this = (VmConstant *)CONCAT44(extraout_var_00,iVar2);
    VmConstant::VmConstant(this,ctx->allocator,type,(SynBase *)0x0);
    this->sValue = __s;
  }
  else {
    this = (VmConstant *)0x0;
    anon_unknown.dwarf_13aa20::Report(ctx,"ERROR: out of stack space");
  }
  return this;
}

Assistant:

VmConstant* LoadFrameStruct(InstructionVMEvalContext &ctx, InstructionVMEvalContext::Storage *storage, unsigned offset, VmType type)
{
	unsigned size = type.size;

	char *value = (char*)ctx.allocator->alloc(size);
	memset(value, 0, size);

	if(!storage->Reserve(ctx, offset, size))
		return (VmConstant*)Report(ctx, "ERROR: out of stack space");

	memcpy(value, storage->data.data + offset, size);

	VmConstant *result = new (ctx.get<VmConstant>()) VmConstant(ctx.allocator, type, NULL);

	result->sValue = value;

	return result;
}